

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O2

void CrossProduct(vertex_t a,vertex_t b,vertex_t c,vertex_t *n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = b.y - a.y;
  fVar5 = c.z - a.z;
  fVar1 = b.x - a.x;
  fVar3 = c.x - a.x;
  fVar4 = c.y - a.y;
  n->x = fVar2 * fVar5 - fVar4 * fVar5;
  n->y = fVar3 * (b.y - a.z) - fVar1 * fVar5;
  n->z = fVar4 * fVar1 - fVar2 * fVar3;
  return;
}

Assistant:

void CrossProduct( vertex_t a, vertex_t b, vertex_t c, vertex_t *n )
{
   GLfloat u1, u2, u3;
   GLfloat v1, v2, v3;

   u1 = b.x - a.x;
   u2 = b.y - a.y;
   u3 = b.y - a.z;

   v1 = c.x - a.x;
   v2 = c.y - a.y;
   v3 = c.z - a.z;

   n->x = u2 * v3 - v2 * v3;
   n->y = u3 * v1 - v3 * u1;
   n->z = u1 * v2 - v1 * u2;
}